

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-properties.c
# Opt level: O0

void gain_specialty(void)

{
  _Bool _Var1;
  player_ability *ppVar2;
  player_ability *ability;
  char buf [120];
  int pick;
  
  _Var1 = gain_specialty_menu((int *)(buf + 0x74));
  if (_Var1) {
    ppVar2 = lookup_ability("player",buf._116_4_,0);
    flag_on_dbg(player->specialties,10,buf._116_4_,"player->specialties","pick");
    strnfmt((char *)&ability,0x78,"Gained the %s specialty.",ppVar2->name);
    history_add(player,(char *)&ability,L'\n');
    player->upkeep->update = player->upkeep->update | 0x3f;
    player->upkeep->redraw = player->upkeep->redraw | 0x800;
  }
  return;
}

Assistant:

void gain_specialty(void)
{
	int pick;

	/* Make one choice */
	if (gain_specialty_menu(&pick)) {
		char buf[120];
		struct player_ability *ability = lookup_ability("player", pick, 0);

		/* Add it to the specialties */
		pf_on(player->specialties, pick);

		/* Specialty taken */
		strnfmt(buf, sizeof(buf), "Gained the %s specialty.", ability->name);

		/* Write a note */
		history_add(player, buf, HIST_GAIN_SPECIALTY);

		/* Update some stuff */
		player->upkeep->update |= (PU_BONUS | PU_HP | PU_MANA | PU_SPELLS |
								   PU_SPECIALTY | PU_TORCH);

		/* Redraw Study Status */
		player->upkeep->redraw |= (PR_STUDY);
	}
}